

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O2

SocketLinux *
rcdiscover::SocketLinux::create
          (SocketLinux *__return_storage_ptr__,in_addr_t dst_ip,uint16_t port,string *iface_name)

{
  string iface_name_00;
  undefined1 in_stack_ffffffffffffffc0 [24];
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)iface_name);
  iface_name_00._M_string_length = in_stack_ffffffffffffffc0._0_8_;
  iface_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffffc0._8_16_;
  iface_name_00._M_dataplus._M_p = &stack0xffffffffffffffc0;
  SocketLinux(__return_storage_ptr__,2,2,0x11,dst_ip,port,iface_name_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

SocketLinux SocketLinux::create(const in_addr_t dst_ip, const uint16_t port,
                                std::string iface_name)
{
  return SocketLinux(AF_INET, SOCK_DGRAM, IPPROTO_UDP, dst_ip, port,
                     std::move(iface_name));
}